

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

_Bool duckdb_je_ckh_remove(tsd_t *tsd,ckh_t *ckh,void *searchkey,void **key,void **data)

{
  long *plVar1;
  uint uVar2;
  ckhc_t *pcVar3;
  void *pvVar4;
  rtree_ctx_t *rtree_ctx;
  long lVar5;
  _Bool _Var6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  arena_t *arena;
  rtree_ctx_t *prVar10;
  byte bVar11;
  uintptr_t key_00;
  uintptr_t uVar12;
  ulong uVar13;
  rtree_t *prVar14;
  size_t usize;
  rtree_metadata_t rVar15;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  sVar8 = ckh_isearch(ckh,searchkey);
  if (sVar8 == 0xffffffffffffffff) goto LAB_01faff8b;
  if (key != (void **)0x0) {
    *key = ckh->tab[sVar8].key;
  }
  if (data != (void **)0x0) {
    *data = ckh->tab[sVar8].data;
  }
  pcVar3 = ckh->tab;
  pcVar3[sVar8].key = (void *)0x0;
  pcVar3[sVar8].data = (void *)0x0;
  uVar9 = ckh->count - 1;
  ckh->count = uVar9;
  uVar2 = ckh->lg_curbuckets;
  if ((uVar9 >> ((byte)uVar2 & 0x3f) != 0) || (uVar2 <= ckh->lg_minbuckets)) goto LAB_01faff8b;
  bVar11 = (byte)uVar2 + 1;
  uVar9 = 0x10L << (bVar11 & 0x3f);
  if (uVar9 < 0x3801) {
    uVar7 = (int)uVar9 + 0x3fU & 0x7fc0;
    if (uVar7 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar7 >> 3]];
    }
    else {
      uVar9 = (ulong)uVar7 * 2 - 1;
      lVar5 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      uVar9 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
      usize = ~uVar9 + (ulong)uVar7 & uVar9;
    }
    uVar13 = 0x4000;
    if (0x3fff < usize) goto LAB_01fafd59;
  }
  else {
    uVar13 = 0x4000;
    if (0x4000 < uVar9) {
      if (uVar9 < 0x7000000000000001) {
        uVar13 = (0x20L << (bVar11 & 0x3f)) - 1;
        lVar5 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        searchkey = (void *)(-1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f));
        uVar13 = ~(ulong)searchkey + uVar9 & (ulong)searchkey;
      }
      else {
        uVar13 = 0;
      }
      if (uVar13 < uVar9) goto LAB_01faff8b;
    }
LAB_01fafd59:
    usize = 0;
    if (!CARRY8(duckdb_je_sz_large_pad,uVar13)) {
      usize = uVar13;
    }
  }
  if (0x8fffffffffffffff < usize + 0x8fffffffffffffff) {
    arena = arena_ichoose(tsd,(arena_t *)searchkey);
    uVar12 = 1;
    prVar10 = (rtree_ctx_t *)
              duckdb_je_arena_palloc
                        ((tsdn_t *)tsd,arena,usize,0x40,true,usize < 0x3801,(tcache_t *)0x0);
    if (prVar10 != (rtree_ctx_t *)0x0) {
      if (tsd == (tsd_t *)0x0) {
        prVar14 = (rtree_t *)&rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar14);
      }
      else {
        prVar14 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1c8,(tsdn_t *)tsd,prVar14,prVar10,uVar12);
      key_00 = (uintptr_t)((uint)(local_1c8.edata)->e_bits & 0xfff);
      pvVar4 = duckdb_je_arenas[key_00].repr;
      if (tsd == (tsd_t *)0x0) {
        prVar14 = (rtree_t *)&rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar14);
      }
      else {
        prVar14 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rVar15 = rtree_metadata_read((tsdn_t *)tsd,prVar14,prVar10,key_00);
      LOCK();
      plVar1 = (long *)((long)pvVar4 + 0x48);
      *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[rVar15.szind];
      UNLOCK();
      rtree_ctx = (rtree_ctx_t *)ckh->tab;
      ckh->tab = (ckhc_t *)prVar10;
      ckh->lg_curbuckets = uVar2 - 1;
      _Var6 = ckh_rebuild(ckh,(ckhc_t *)rtree_ctx);
      if (_Var6) {
        prVar10 = (rtree_ctx_t *)ckh->tab;
        if (tsd == (tsd_t *)0x0) {
          prVar14 = (rtree_t *)&rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar14);
        }
        else {
          prVar14 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
          ;
        }
        rtree_read(&local_1c8,(tsdn_t *)tsd,prVar14,prVar10,uVar12);
        uVar12 = (uintptr_t)((uint)(local_1c8.edata)->e_bits & 0xfff);
        pvVar4 = duckdb_je_arenas[uVar12].repr;
        if (tsd == (tsd_t *)0x0) {
          prVar14 = (rtree_t *)&rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar14);
        }
        else {
          prVar14 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
          ;
        }
        rVar15 = rtree_metadata_read((tsdn_t *)tsd,prVar14,prVar10,uVar12);
        LOCK();
        plVar1 = (long *)((long)pvVar4 + 0x48);
        *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[rVar15.szind];
        UNLOCK();
        arena_dalloc_no_tcache((tsdn_t *)tsd,prVar10);
        ckh->tab = (ckhc_t *)rtree_ctx;
        ckh->lg_curbuckets = uVar2;
      }
      else {
        if (tsd == (tsd_t *)0x0) {
          prVar14 = (rtree_t *)&rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar14);
        }
        else {
          prVar14 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
          ;
        }
        rtree_read(&local_1c8,(tsdn_t *)tsd,prVar14,rtree_ctx,uVar12);
        uVar12 = (uintptr_t)((uint)(local_1c8.edata)->e_bits & 0xfff);
        pvVar4 = duckdb_je_arenas[uVar12].repr;
        if (tsd == (tsd_t *)0x0) {
          prVar14 = (rtree_t *)&rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar14);
        }
        else {
          prVar14 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
          ;
        }
        rVar15 = rtree_metadata_read((tsdn_t *)tsd,prVar14,rtree_ctx,uVar12);
        LOCK();
        plVar1 = (long *)((long)pvVar4 + 0x48);
        *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[rVar15.szind];
        UNLOCK();
        arena_dalloc_no_tcache((tsdn_t *)tsd,rtree_ctx);
      }
    }
  }
LAB_01faff8b:
  return sVar8 == 0xffffffffffffffff;
}

Assistant:

bool
ckh_remove(tsd_t *tsd, ckh_t *ckh, const void *searchkey, void **key,
    void **data) {
	size_t cell;

	assert(ckh != NULL);

	cell = ckh_isearch(ckh, searchkey);
	if (cell != SIZE_T_MAX) {
		if (key != NULL) {
			*key = (void *)ckh->tab[cell].key;
		}
		if (data != NULL) {
			*data = (void *)ckh->tab[cell].data;
		}
		ckh->tab[cell].key = NULL;
		ckh->tab[cell].data = NULL; /* Not necessary. */

		ckh->count--;
		/* Try to halve the table if it is less than 1/4 full. */
		if (ckh->count < (ZU(1) << (ckh->lg_curbuckets
		    + LG_CKH_BUCKET_CELLS - 2)) && ckh->lg_curbuckets
		    > ckh->lg_minbuckets) {
			/* Ignore error due to OOM. */
			ckh_shrink(tsd, ckh);
		}

		return false;
	}

	return true;
}